

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O2

Machine * unifyVariable(Machine *__return_storage_ptr__,Machine *m,Register r)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  undefined1 local_58 [52];
  key_type local_24 [2];
  Register r_local;
  
  local_24[0].r = r.r;
  if (m->mode == Write) {
    Hcell::ref((Hcell *)local_58,(Hix)(m->h).hix);
    pmVar1 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
             operator[](&m->heap,&m->h);
    Hcell::operator=(pmVar1,(Hcell *)local_58);
    std::__cxx11::string::~string((string *)(local_58 + 8));
    pmVar1 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
             operator[](&m->heap,&m->h);
    pmVar2 = std::
             map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
             ::operator[](&m->regval,local_24);
    Hcell::operator=(pmVar2,pmVar1);
    (m->h).hix = (m->h).hix + 1;
  }
  else if (m->mode == Read) {
    pmVar1 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
             operator[](&m->heap,&m->s);
    pmVar2 = std::
             map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
             ::operator[](&m->regval,local_24);
    Hcell::operator=(pmVar2,pmVar1);
  }
  (m->s).hix = (m->s).hix + 1;
  Machine::Machine(__return_storage_ptr__,m);
  return __return_storage_ptr__;
}

Assistant:

Machine unifyVariable(Machine m, Register r) {
    switch (m.mode) {
        case Mode::Read:
            m.regval[r] = m.heap[m.s];
            break;
        case Mode::Write:
            m.heap[m.h] = Hcell::ref(m.h);
            m.regval[r] = m.heap[m.h];
            m.h += 1;
            break;
    }
    m.s += 1;
    return m;
}